

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O0

void __thiscall QtMWidgets::TextLabel::paintEvent(TextLabel *this,QPaintEvent *e)

{
  int iVar1;
  Int IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TextLabelPrivate *pTVar7;
  qreal qVar8;
  undefined1 auVar9 [16];
  QPoint local_a8;
  QSizeF local_a0;
  QPoint local_90;
  QSizeF local_88;
  QPoint local_78;
  QPoint local_70;
  QPoint local_68;
  QPoint topLeft;
  QFlags<Qt::AlignmentFlag> local_48;
  Int local_44;
  Int local_40;
  int vAlign;
  undefined1 local_30 [8];
  QRect cr;
  QPainter p;
  QPaintEvent *e_local;
  TextLabel *this_local;
  
  QFrame::paintEvent((QPaintEvent *)this);
  QPainter::QPainter((QPainter *)&cr.x2,(QPaintDevice *)&this->field_0x10);
  auVar9 = QWidget::contentsRect();
  cr._0_8_ = auVar9._8_8_;
  local_30 = auVar9._0_8_;
  QPainter::setClipRect(&cr.x2,local_30,1);
  QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
  ::operator->(&this->d);
  QPainter::setPen((QColor *)&cr.x2);
  QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
  ::operator->(&this->d);
  QStaticText::textOption();
  local_48.i = (Int)QTextOption::alignment((QTextOption *)&topLeft);
  local_44 = (Int)QFlags<Qt::AlignmentFlag>::operator&(&local_48,AlignVertical_Mask);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
  QTextOption::~QTextOption((QTextOption *)&topLeft);
  local_40 = IVar2;
  local_68 = QRect::topLeft((QRect *)local_30);
  if (local_40 == 0x40) {
    iVar3 = QPoint::x(&local_68);
    pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    iVar1 = pTVar7->margin;
    local_78 = QRect::bottomLeft((QRect *)local_30);
    iVar4 = QPoint::y(&local_78);
    QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
    ::operator->(&this->d);
    local_88.wd = (qreal)QStaticText::size();
    qVar8 = QSizeF::height(&local_88);
    iVar5 = qRound(qVar8);
    pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    QPoint::QPoint(&local_70,iVar3 + iVar1,(iVar4 - iVar5) - pTVar7->margin);
    local_68 = local_70;
  }
  else if (local_40 == 0x80) {
    iVar3 = QPoint::x(&local_68);
    pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    iVar1 = pTVar7->margin;
    iVar4 = QPoint::y(&local_68);
    iVar5 = QRect::height((QRect *)local_30);
    QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
    ::operator->(&this->d);
    local_a0.wd = (qreal)QStaticText::size();
    qVar8 = QSizeF::height(&local_a0);
    iVar6 = qRound(qVar8);
    QPoint::QPoint(&local_90,iVar3 + iVar1,(iVar4 + iVar5 / 2) - iVar6 / 2);
    local_68 = local_90;
  }
  else {
    pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    if (pTVar7->margin != 0) {
      pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
               ::operator->(&this->d);
      iVar1 = pTVar7->margin;
      pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
               ::operator->(&this->d);
      QPoint::QPoint(&local_a8,iVar1,pTVar7->margin);
      QPoint::operator+=(&local_68,&local_a8);
    }
  }
  pTVar7 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
           ::operator->(&this->d);
  QPainter::drawStaticText((QPainter *)&cr.x2,&local_68,&pTVar7->staticText);
  QPainter::~QPainter((QPainter *)&cr.x2);
  return;
}

Assistant:

void
TextLabel::paintEvent( QPaintEvent * e )
{
	QFrame::paintEvent( e );

	QPainter p( this );
	const QRect cr = contentsRect();

	p.setClipRect( cr );
	p.setPen( d->color );

	int vAlign = d->staticText.textOption().alignment() & Qt::AlignVertical_Mask;

	QPoint topLeft = cr.topLeft();

	switch( vAlign )
	{
		case Qt::AlignBottom :
			topLeft = QPoint( topLeft.x() + d->margin,
				cr.bottomLeft().y() - qRound( d->staticText.size().height() ) -
				d->margin );
		break;

		case Qt::AlignVCenter :
			topLeft = QPoint( topLeft.x() + d->margin,
				topLeft.y() + cr.height() / 2 -
					qRound( d->staticText.size().height() ) / 2 );
		break;

		default :
		{
			if( d->margin != 0 )
				topLeft += QPoint( d->margin, d->margin );
		}
		break;
	}

	p.drawStaticText( topLeft, d->staticText );
}